

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_recovery.cc
# Opt level: O1

void __thiscall
ClockRecovery::work(ClockRecovery *this,
                   shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                        *qout)

{
  _ComplexT _Var1;
  pointer pcVar2;
  iterator __position;
  pointer pcVar3;
  SamplePublisher *this_00;
  _ComplexT _Var4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  pointer *__ptr;
  ulong uVar9;
  pointer pcVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  _ComplexT _Var14;
  float fVar16;
  undefined8 uVar15;
  undefined8 extraout_XMM0_Qb;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_68;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_60 [3];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar5 = (int)(qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_70);
  if (local_70 == (undefined1  [8])0x0) {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,iVar5);
  }
  else {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               local_78);
    std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>>
              ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&this->tmp_,
               (this->tmp_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)local_70,
               *(pointer *)((long)local_70 + 8));
    local_60[0]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_70;
    local_70 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,local_60);
    if (local_60[0]._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_60,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_60[0]._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_60[0]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    uVar9 = (long)(this->tmp_).
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tmp_).
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (*(pointer *)((long)local_78 + 8) != *(pointer *)local_78) {
      *(pointer *)((long)local_78 + 8) = *(pointer *)local_78;
    }
    fVar11 = (float)uVar9 / this->omega_;
    uVar6 = (ulong)fVar11;
    local_60[1]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )&this->tmp_;
    local_60[2]._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )qout;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::reserve
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_78,
               (long)(fVar11 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
    uVar6 = 0;
    do {
      if (uVar9 <= uVar6) break;
      iVar5 = (int)this->mu_;
      uVar8 = (long)iVar5 + uVar6 + 7;
      if (uVar8 < uVar9) {
        uVar6 = uVar6 + (long)iVar5;
        pcVar2 = (this->tmp_).
                 super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        fVar11 = this->mu_ - (float)iVar5;
        this->mu_ = fVar11;
        _Var14 = 0;
        lVar7 = 0;
        do {
          _Var1 = pcVar2[uVar6 + lVar7]._M_value;
          fVar12 = (float)_Var14 + mmseTaps[(int)(fVar11 * 128.0)][lVar7] * (float)_Var1;
          _Var14 = CONCAT44((float)(_Var14 >> 0x20) +
                            mmseTaps[(int)(fVar11 * 128.0)][lVar7] * (float)(_Var1 >> 0x20),fVar12);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        _Var1 = (this->p1t_)._M_value;
        _Var4 = (this->c1t_)._M_value;
        (this->p1t_)._M_value = (this->p0t_)._M_value;
        (this->p2t_)._M_value = _Var1;
        (this->p0t_)._M_value = _Var14;
        (this->c1t_)._M_value = (this->c0t_)._M_value;
        (this->c2t_)._M_value = _Var4;
        (this->c0t_)._M_value =
             CONCAT44(-(uint)(0.0 < *(float *)((long)&(this->p0t_)._M_value + 4)),
                      -(uint)(0.0 < fVar12)) & 0x3f8000003f800000;
        __position._M_current = *(complex<float> **)((long)local_78 + 8);
        if (__position._M_current == *(complex<float> **)((long)local_78 + 0x10)) {
          std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
          _M_realloc_insert<std::complex<float>const&>
                    ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)local_78,
                     __position,&this->p0t_);
        }
        else {
          (__position._M_current)->_M_value = (this->p0t_)._M_value;
          *(long *)((long)local_78 + 8) = *(long *)((long)local_78 + 8) + 8;
        }
        _Var14 = (this->p1t_)._M_value;
        fVar19 = (float)_Var14;
        fVar20 = (float)(_Var14 >> 0x20);
        _Var14 = (this->c0t_)._M_value;
        _Var1 = (this->c2t_)._M_value;
        fVar13 = (float)_Var14 - (float)_Var1;
        fVar16 = (float)(_Var14 >> 0x20) - (float)(_Var1 >> 0x20);
        fVar18 = fVar16 * fVar20;
        fVar11 = fVar18 + fVar13 * fVar19;
        fVar12 = fVar18;
        fVar17 = fVar18;
        if ((NAN(fVar11)) && (NAN(fVar16 * fVar19 - fVar13 * fVar20))) {
          uVar15 = __mulsc3(CONCAT44(fVar16,fVar13),fVar16,fVar19,-fVar20);
          fVar11 = (float)uVar15;
          fVar18 = (float)((ulong)uVar15 >> 0x20);
          fVar12 = (float)extraout_XMM0_Qb;
          fVar17 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
        }
        _Var14 = (this->p0t_)._M_value;
        _Var1 = (this->p2t_)._M_value;
        fVar20 = (float)_Var14 - (float)_Var1;
        fVar21 = (float)(_Var14 >> 0x20) - (float)(_Var1 >> 0x20);
        _Var14 = (this->c1t_)._M_value;
        fVar16 = (float)_Var14;
        fVar19 = (float)(_Var14 >> 0x20);
        fVar13 = fVar21 * fVar19 + fVar20 * fVar16;
        if ((NAN(fVar13)) && (NAN(fVar21 * fVar16 - fVar20 * fVar19))) {
          local_48 = fVar11;
          fStack_44 = fVar18;
          fStack_40 = fVar12;
          fStack_3c = fVar17;
          fVar13 = (float)__mulsc3(CONCAT44(fVar21,fVar20),fVar21,fVar16,-fVar19);
          fVar11 = local_48;
        }
        fVar11 = (ABS((fVar13 - fVar11) + 1.0) - ABS((fVar13 - fVar11) + -1.0)) * 0.5;
        fVar12 = this->omegaGain_ * fVar11 + this->omega_;
        this->omega_ = fVar12;
        if (fVar12 < this->omegaMin_) {
          this->omega_ = this->omegaMax_;
        }
        if (this->omegaMax_ <= this->omega_ && this->omega_ != this->omegaMax_) {
          this->omega_ = this->omegaMin_;
        }
        this->mu_ = fVar11 * this->muGain_ + this->omega_ + this->mu_;
      }
    } while (uVar8 < uVar9);
    if (uVar6 != 0) {
      pcVar10 = (((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                 local_60[1]._M_t.
                 super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                 ._M_head_impl)->_M_impl).super__Vector_impl_data._M_start;
      pcVar2 = pcVar10 + uVar6;
      __n = (long)(this->tmp_).
                  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2;
      if (__n != 0) {
        memmove(pcVar10,pcVar2,__n);
      }
      pcVar3 = (this->tmp_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar10 = (pointer)((long)pcVar10 + ((long)pcVar3 - (long)pcVar2));
      if (pcVar3 != pcVar10) {
        (this->tmp_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar10;
      }
    }
    this_00 = (this->samplePublisher_)._M_t.
              super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
              super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
              super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    if (this_00 != (SamplePublisher *)0x0) {
      SamplePublisher::publish(this_00,(Samples *)local_78);
    }
    local_68._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_78;
    local_78 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              (((__shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)local_60[2]._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl)->_M_ptr,&local_68);
    if (local_68._M_t.
        super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         )0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)&local_68,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                   local_68._M_t.
                   super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
                   ._M_head_impl);
    }
    local_68._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
            )0x0;
    if (local_78 != (undefined1  [8])0x0) {
      std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
      ::operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                    *)local_78,
                   (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_78);
    }
  }
  if (local_70 != (undefined1  [8])0x0) {
    std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::
    operator()((default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>
                *)local_70,
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  }
  return;
}

Assistant:

void ClockRecovery::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  tmp_.insert(tmp_.end(), input->begin(), input->end());

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Omega is number of samples per symbol, so this
  // estimates the number of symbols we should find in this call.
  auto nsamples = tmp_.size();
  output->clear();
  output->reserve(nsamples / omega_);

  // Process 1 sample per iteration.
  // This does not allow vectorization but is more stable than the
  // vectorized implementation (see git history of this file).
  // It is roughly 15% slower than previous implementation.
  size_t i = 0;
  while (i < nsamples) {
    float muf;
    int mui;
    const std::complex<float>* s;

    // Populate phase and sample pointer
    muf = (float) mu_;
    mui = (int) mu_;
    s = &tmp_[i + mui];

    // Check that we don't go out of range
    if ((i + mui + 7) >= nsamples) {
      break;
    }

    // In range; update sample index and phase
    i += mui;
    mu_ -= mui;

    // Normalize mu to [0.0, 1.0) so we can use it to
    // choose the right interpolation filter.
    muf = muf - (float) mui;

    // Run interpolator to get interpolated samples at offset mu
    std::complex<float> acc = 0.0f;
    const auto taps = mmseTaps[(int) (muf * 128.0f)];
    for (auto k = 0; k < NUM_TAPS; k++) {
      acc += taps[k] * s[k];
    }

    // Push down sample
    p2t_ = p1t_;
    p1t_ = p0t_;
    p0t_ = acc;

    // Push down associated complex quadrant
    c2t_ = c1t_;
    c1t_ = c0t_;
    c0t_.real((p0t_.real() > 0.0f ? 1.0f : 0.0f));
    c0t_.imag((p0t_.imag() > 0.0f ? 1.0f : 0.0f));

    // Use interpolated sample as output
    // Then use the estimated error to update omega_ and mu_
    output->push_back(p0t_);

    // Compute error
    std::complex<float> x = (c0t_ - c2t_) * std::conj(p1t_);
    std::complex<float> y = (p0t_ - p2t_) * std::conj(c1t_);
    std::complex<float> u = y - x;

    // Clip error to [-1.0, 1.0]
    float mm = u.real();
    mm = 0.5f * (fabsf(mm + 1.0f) - fabsf(mm - 1.0f));

    // Update omega
    omega_ += omegaGain_ * mm;

    // Wrap omega if it hits the lower or upper bound.
    // If the algorithm is biased to always increase omega at a
    // certain point, it will wrap and start from minimum, in the
    // hope it locks on to the signal again.
    if (omega_ < omegaMin_) {
      omega_ = omegaMax_;
    }
    if (omega_ > omegaMax_) {
      omega_ = omegaMin_;
    }

    // Update mu with new omega
    // It is OK if this is bigger than 1.0 because that means
    // we need to skip a few samples in the next iteration.
    mu_ += omega_ + muGain_ * mm;
  }

  // Index i was not used yet. Copy the sample at index i and
  // everything after it to the beginning of the sample buffer.
  tmp_.erase(tmp_.begin(), tmp_.begin() + i);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}